

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O3

void ryg_dxt::sCompressDXTBlock(sU8 *dest,sU32 *src,sBool alpha,sInt quality)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined8 uVar7;
  undefined8 uVar8;
  int *piVar9;
  sInt i_1;
  sU32 sVar10;
  sU32 *psVar11;
  int *piVar12;
  ushort uVar13;
  uint uVar14;
  undefined7 in_register_00000011;
  long lVar15;
  sInt i_3;
  int iVar16;
  int iVar17;
  int iVar18;
  ushort uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  int *piVar25;
  ulong uVar26;
  sInt i_2;
  sU32 *psVar27;
  int iVar28;
  int iVar29;
  undefined1 *puVar30;
  long lVar31;
  ushort uVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  ushort uVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  sInt err [8];
  sInt mu [3];
  sInt max [3];
  sInt min [3];
  sF32 covf [6];
  Pixel dblock [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  int local_e8 [4];
  Pixel *local_d8;
  ushort *local_d0;
  uint local_c4 [7];
  uint local_a8 [4];
  float local_98 [8];
  sU32 local_78 [18];
  
  if ((int)CONCAT71(in_register_00000011,alpha) != 0) {
    CompressAlphaBlock(dest,src);
    dest = dest + 8;
  }
  uVar21 = *src;
  lVar15 = 1;
  uVar22 = uVar21;
  uVar14 = uVar21;
  do {
    uVar34 = src[lVar15];
    if (uVar34 <= uVar22) {
      uVar22 = uVar34;
    }
    if (uVar34 < uVar14) {
      uVar34 = uVar14;
    }
    uVar14 = uVar34;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x10);
  if (uVar22 == uVar14) {
    uVar26 = (ulong)(uVar21 >> 0x10 & 0xff);
    uVar24 = (ulong)(uVar21 >> 8 & 0xff);
    uVar22 = 0xaaaaaaaa;
    uVar13 = (ushort)(byte)OMatch5[(ulong)(uVar21 & 0xff) * 2 + 1] |
             (ushort)(byte)OMatch6[uVar24 * 2 + 1] << 5 |
             (ushort)(byte)OMatch5[uVar26 * 2 + 1] << 0xb;
    uVar19 = (ushort)(byte)OMatch5[(ulong)(uVar21 & 0xff) * 2] |
             (ushort)(byte)OMatch6[uVar24 * 2] << 5 | (ushort)(byte)OMatch5[uVar26 * 2] << 0xb;
  }
  else {
    psVar11 = src;
    if (quality != 0) {
      piVar12 = (int *)&local_f8;
      psVar11 = local_78;
      piVar25 = local_e8;
      lVar15 = 0;
      psVar27 = src;
      do {
        puVar30 = &QuantRBTab;
        if (lVar15 == 1) {
          puVar30 = &QuantGTab;
        }
        local_e8[0] = 0;
        local_e8[1] = 0;
        local_e8[2] = 0;
        local_e8[3] = 0;
        local_f8 = 0;
        uStack_f0 = 0;
        lVar31 = 0;
        piVar9 = piVar12;
        do {
          piVar12 = piVar25;
          piVar25 = piVar9;
          bVar1 = *(byte *)((long)psVar27 + lVar31);
          bVar2 = puVar30[(long)(*piVar12 * 5 + piVar12[1] * 3 >> 4) + (ulong)bVar1 + 8];
          *(byte *)((long)psVar11 + lVar31) = bVar2;
          iVar16 = (uint)bVar1 - (uint)bVar2;
          *piVar25 = iVar16;
          bVar1 = *(byte *)((long)psVar27 + lVar31 + 4);
          bVar2 = puVar30[(long)(piVar12[1] * 5 + piVar12[2] * 3 + iVar16 * 7 + *piVar12 >> 4) +
                          (ulong)bVar1 + 8];
          *(byte *)((long)psVar11 + lVar31 + 4) = bVar2;
          iVar16 = (uint)bVar1 - (uint)bVar2;
          piVar25[1] = iVar16;
          bVar1 = *(byte *)((long)psVar27 + lVar31 + 8);
          bVar2 = puVar30[(long)(piVar12[2] * 5 + piVar12[3] * 3 + iVar16 * 7 + piVar12[1] >> 4) +
                          (ulong)bVar1 + 8];
          *(byte *)((long)psVar11 + lVar31 + 8) = bVar2;
          iVar16 = (uint)bVar1 - (uint)bVar2;
          piVar25[2] = iVar16;
          bVar1 = *(byte *)((long)psVar27 + lVar31 + 0xc);
          bVar2 = puVar30[(long)(piVar12[3] * 5 + iVar16 * 7 + piVar12[2] >> 4) + (ulong)bVar1 + 8];
          *(byte *)((long)psVar11 + lVar31 + 0xc) = bVar2;
          piVar25[3] = (uint)bVar1 - (uint)bVar2;
          lVar31 = lVar31 + 0x10;
          piVar9 = piVar12;
        } while ((int)lVar31 != 0x40);
        lVar15 = lVar15 + 1;
        psVar11 = (sU32 *)((long)psVar11 + 1);
        psVar27 = (sU32 *)((long)psVar27 + 1);
      } while (lVar15 != 3);
      psVar11 = local_78;
    }
    psVar27 = psVar11 + 1;
    lVar15 = 0;
    do {
      uVar14 = (uint)*(byte *)((long)psVar11 + lVar15);
      uVar26 = 0;
      uVar21 = (uint)*(byte *)((long)psVar11 + lVar15);
      uVar22 = uVar21;
      do {
        bVar1 = *(byte *)((long)psVar27 + uVar26);
        uVar14 = uVar14 + bVar1;
        uVar34 = (uint)bVar1;
        if (uVar34 <= uVar21) {
          uVar21 = uVar34;
        }
        uVar20 = (uint)bVar1;
        if (uVar34 < uVar22) {
          uVar20 = uVar22;
        }
        uVar22 = uVar20;
        uVar26 = uVar26 + 4;
      } while (uVar26 < 0x3c);
      local_c4[lVar15] = uVar14 + 8 >> 4;
      local_a8[lVar15] = uVar21;
      local_c4[lVar15 + 3] = uVar22;
      lVar15 = lVar15 + 1;
      psVar27 = (sU32 *)((long)psVar27 + 1);
    } while (lVar15 != 3);
    local_d8 = (Pixel *)src;
    local_d0 = (ushort *)dest;
    lVar15 = 0;
    uVar21 = 0;
    uVar22 = 0;
    iVar16 = 0;
    iVar28 = 0;
    local_e8[0] = 0;
    local_e8[1] = 0;
    do {
      iVar37 = *(byte *)((long)psVar11 + lVar15 * 4 + 2) - local_c4[2];
      iVar33 = *(byte *)((long)psVar11 + lVar15 * 4 + 1) - local_c4[1];
      iVar36 = (byte)psVar11[lVar15] - local_c4[0];
      uVar21 = uVar21 + iVar37 * iVar37;
      uVar22 = uVar22 + iVar33 * iVar37;
      iVar16 = iVar16 + iVar37 * iVar36;
      uVar14 = iVar36 * iVar33;
      iVar28 = iVar28 + iVar33 * iVar33;
      local_e8[0] = local_e8[0] + uVar14;
      local_e8[1] = local_e8[1] + iVar36 * iVar36;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x10);
    local_f8 = CONCAT44(uVar22,uVar21);
    uStack_f0 = CONCAT44(iVar28,iVar16);
    lVar15 = 0;
    do {
      local_98[lVar15] = (float)*(int *)((long)&local_f8 + lVar15 * 4) / 255.0;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 6);
    fVar41 = (float)((int)local_c4._12_8_ - (int)local_a8._0_8_);
    fVar42 = (float)(SUB84(local_c4._12_8_,4) - SUB84(local_a8._0_8_,4));
    iVar16 = 4;
    fVar40 = (float)(int)(local_c4[5] - local_a8[2]);
    do {
      fVar39 = fVar41 * SUB84(local_98._4_8_,4) +
               fVar40 * local_98[0] + (float)local_98._4_8_ * fVar42;
      fVar43 = fVar42 * (float)local_98._16_8_;
      fVar42 = fVar41 * (float)local_98._16_8_ +
               fVar40 * (float)local_98._4_8_ + fVar42 * local_98[3];
      fVar41 = fVar41 * SUB84(local_98._16_8_,4) + fVar40 * SUB84(local_98._4_8_,4) + fVar43;
      iVar16 = iVar16 + -1;
      fVar40 = fVar39;
    } while (iVar16 != 0);
    fVar40 = ABS(fVar39);
    if (ABS(fVar39) <= ABS(fVar42)) {
      fVar40 = ABS(fVar42);
    }
    if (fVar40 <= ABS(fVar41)) {
      fVar40 = ABS(fVar41);
    }
    if (4.0 <= fVar40) {
      fVar40 = 512.0 / fVar40;
      iVar16 = (int)(fVar39 * fVar40);
      iVar33 = (int)(fVar42 * fVar40);
      iVar36 = (int)(fVar41 * fVar40);
    }
    else {
      iVar33 = 300;
      iVar36 = 0x3a;
      iVar16 = 0x94;
    }
    iVar37 = 0x7fffffff;
    iVar29 = -0x7fffffff;
    lVar15 = 0;
    uVar20 = 0x10;
    uVar34 = 0;
    do {
      uVar4 = psVar11[lVar15];
      auVar5[0xc] = (char)(uVar4 >> 0x18);
      auVar5._0_12_ = ZEXT712(0);
      auVar6[1] = 0;
      auVar6[0] = (byte)(uVar4 >> 0x10);
      auVar6._2_3_ = auVar5._10_3_;
      auVar6._5_8_ = 0;
      iVar17 = (uVar4 & 0xff) * iVar36 + (uint)*(byte *)((long)psVar11 + lVar15 * 4 + 2) * iVar16 +
               (int)CONCAT72(SUB137(auVar6 << 0x40,6),(ushort)(byte)(uVar4 >> 8)) * iVar33;
      if (iVar17 < iVar37) {
        uVar34 = psVar11[lVar15];
        local_c4[1] = uVar34 >> 8;
        uVar20 = uVar34 >> 0x10;
        iVar37 = iVar17;
      }
      if (iVar29 < iVar17) {
        uVar21 = psVar11[lVar15];
        uVar22 = uVar21 >> 8;
        uVar14 = uVar21 >> 0x10;
        iVar29 = iVar17;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x10);
    iVar16 = (uVar14 & 0xff) * 0x1f;
    iVar33 = (uVar22 & 0xff) * 0x3f;
    iVar36 = (uVar21 & 0xff) * 0x1f;
    uVar14 = ((iVar36 + 0x80U >> 8) + iVar36 + 0x80 >> 8) +
             (iVar33 + (iVar33 + 0x80U >> 8) + 0x80 >> 3 & 0xfe0) +
             ((iVar16 + 0x80U >> 8) + iVar16 + 0x80 & 0xffff7f00) * 8;
    iVar16 = (uVar20 & 0xff) * 0x1f;
    iVar33 = (local_c4[1] & 0xff) * 0x3f;
    iVar36 = (uVar34 & 0xff) * 0x1f;
    uVar21 = ((iVar36 + 0x80U >> 8) + iVar36 + 0x80 >> 8) +
             ((iVar33 + 0x80U >> 8) + iVar33 + 0x80 >> 3 & 0xfe0) +
             ((iVar16 + 0x80U >> 8) + iVar16 + 0x80 & 0xffff7f00) * 8;
    uVar34 = 0;
    uVar22 = 0;
    uVar19 = (ushort)uVar14;
    uVar13 = (ushort)uVar21;
    if (uVar19 != uVar13) {
      bVar1 = Expand5[(uVar14 & 0xffff) >> 0xb];
      bVar2 = Expand6[(uVar14 & 0xffff) >> 5 & 0x3f];
      bVar3 = Expand5[uVar14 & 0x1f];
      local_f8._0_5_ = CONCAT14(Expand5[uVar21 & 0x1f],(uint)CONCAT21(CONCAT11(bVar1,bVar2),bVar3));
      local_f8 = (ulong)CONCAT25(CONCAT11(Expand5[uVar13 >> 0xb],Expand6[uVar13 >> 5 & 0x3f]),
                                 (undefined5)local_f8);
      iVar37 = (uint)(byte)Expand5[uVar13 >> 0xb] - (uint)bVar1;
      iVar16 = iVar37 * 0x55;
      iVar29 = (uint)(byte)Expand6[uVar13 >> 5 & 0x3f] - (uint)bVar2;
      iVar33 = iVar29 * 0x55;
      iVar17 = (uint)(byte)Expand5[uVar21 & 0x1f] - (uint)bVar3;
      iVar36 = iVar17 * 0x55;
      uStack_f0 = CONCAT71(CONCAT61(CONCAT51(uStack_f0._3_5_,
                                             (char)(iVar16 + (iVar16 + 0x80U >> 8) + 0x80 >> 8) +
                                             bVar1),
                                    (char)(iVar33 + (iVar33 + 0x80U >> 8) + 0x80 >> 8) + bVar2),
                           (char)(iVar36 + (iVar36 + 0x80U >> 8) + 0x80 >> 8) + bVar3);
      uVar7 = uStack_f0;
      iVar37 = iVar37 * 0xaa;
      uStack_f0._7_1_ = (undefined1)((uint)iVar28 >> 0x18);
      iVar29 = iVar29 * 0xaa;
      iVar17 = iVar17 * 0xaa;
      uStack_f0._0_4_ = (undefined4)uVar7;
      uStack_f0._0_5_ =
           CONCAT14((char)(iVar17 + (iVar17 + 0x80U >> 8) + 0x80 >> 8) + bVar3,(undefined4)uStack_f0
                   );
      uStack_f0 = CONCAT35(CONCAT21(CONCAT11(uStack_f0._7_1_,
                                             (char)(iVar37 + (iVar37 + 0x80U >> 8) + 0x80 >> 8) +
                                             bVar1),
                                    (char)(iVar29 + (iVar29 + 0x80U >> 8) + 0x80 >> 8) + bVar2),
                           (undefined5)uStack_f0);
      uVar22 = MatchColorsBlock((Pixel *)src,(Pixel *)&local_f8,quality != 0);
    }
    dest = (sU8 *)local_d0;
    uVar7 = uStack_f0;
    lVar15 = 0;
    iVar33 = 0;
    iVar28 = 0;
    iVar16 = 0;
    iVar29 = 0;
    iVar37 = 0;
    iVar36 = 0;
    sVar10 = uVar22;
    do {
      uVar26 = (ulong)((sVar10 & 3) << 2);
      iVar17 = *(int *)((long)crnlib::dxt1_endpoint_optimizer::refine_solution::w1Tab + uVar26);
      uVar34 = uVar34 + *(int *)(RefineBlock(ryg_dxt::Pixel_const*,unsigned_short&,unsigned_short&,unsigned_int)
                                 ::prods + uVar26);
      uVar21 = (uint)*(byte *)((long)psVar11 + lVar15 * 4 + 2);
      iVar33 = iVar33 + iVar17 * uVar21;
      uVar14 = (uint)*(byte *)((long)psVar11 + lVar15 * 4 + 1);
      iVar28 = iVar28 + iVar17 * uVar14;
      iVar16 = iVar16 + iVar17 * (uint)(byte)psVar11[lVar15];
      iVar29 = iVar29 + uVar21;
      iVar37 = iVar37 + uVar14;
      iVar36 = iVar36 + (uint)(byte)psVar11[lVar15];
      lVar15 = lVar15 + 1;
      sVar10 = sVar10 >> 2;
    } while (lVar15 != 0x10);
    uVar21 = uVar34 >> 8 & 0xff;
    if (uVar21 != 0 && 0xffff < uVar34) {
      iVar23 = (int)uVar34 >> 0x10;
      uVar34 = uVar34 & 0xff;
      iVar17 = uVar21 * iVar23 - uVar34 * uVar34;
      if (iVar17 != 0) {
        iVar35 = iVar29 * 3 - iVar33;
        iVar29 = iVar37 * 3 - iVar28;
        iVar37 = iVar36 * 3 - iVar16;
        fVar40 = 0.3647059 / (float)iVar17;
        fVar41 = (fVar40 * 63.0) / 31.0;
        iVar36 = (int)((float)(int)(uVar21 * iVar33 - uVar34 * iVar35) * fVar40 + 0.5);
        iVar17 = 0;
        if (iVar36 < 1) {
          iVar36 = iVar17;
        }
        if (0x1e < iVar36) {
          iVar36 = 0x1f;
        }
        iVar18 = (int)((float)(int)(uVar21 * iVar28 - uVar34 * iVar29) * fVar41 + 0.5);
        if (iVar18 < 1) {
          iVar18 = iVar17;
        }
        if (0x3e < iVar18) {
          iVar18 = 0x3f;
        }
        uVar21 = (uint)((float)(int)(uVar21 * iVar16 - iVar37 * uVar34) * fVar40 + 0.5);
        if ((int)uVar21 < 1) {
          uVar21 = 0;
        }
        if (0x1e < (int)uVar21) {
          uVar21 = 0x1f;
        }
        iVar33 = (int)((float)(int)(iVar35 * iVar23 - iVar33 * uVar34) * fVar40 + 0.5);
        uVar14 = uVar21 | iVar36 << 0xb | iVar18 << 5;
        uVar38 = (ushort)uVar14;
        if (iVar33 < 1) {
          iVar33 = 0;
        }
        if (0x1e < iVar33) {
          iVar33 = 0x1f;
        }
        iVar28 = (int)((float)(int)(iVar29 * iVar23 - iVar28 * uVar34) * fVar41 + 0.5);
        if (iVar28 < 1) {
          iVar28 = iVar17;
        }
        if (0x3e < iVar28) {
          iVar28 = 0x3f;
        }
        uVar34 = (uint)((float)(int)(iVar37 * iVar23 - uVar34 * iVar16) * fVar40 + 0.5);
        if ((int)uVar34 < 1) {
          uVar34 = 0;
        }
        if (0x1e < (int)uVar34) {
          uVar34 = 0x1f;
        }
        uVar20 = uVar34 | iVar33 << 0xb | iVar28 << 5;
        uVar32 = (ushort)uVar20;
        if ((uVar13 != uVar32) || (uVar19 != uVar38)) {
          uVar19 = uVar38;
          if (uVar38 == uVar32) {
            uVar22 = 0;
            uVar13 = uVar38;
          }
          else {
            uVar14 = uVar14 & 0xffff;
            bVar1 = Expand5[uVar14 >> 0xb];
            bVar2 = Expand6[uVar14 >> 5 & 0x3f];
            bVar3 = Expand5[uVar21 & 0x1f];
            uVar20 = uVar20 & 0xffff;
            local_f8._0_5_ =
                 CONCAT14(Expand5[uVar34 & 0x1f],(uint)CONCAT21(CONCAT11(bVar1,bVar2),bVar3));
            local_f8 = (ulong)CONCAT25(CONCAT11(Expand5[uVar20 >> 0xb],Expand6[uVar20 >> 5 & 0x3f]),
                                       (undefined5)local_f8);
            iVar29 = (uint)(byte)Expand5[uVar20 >> 0xb] - (uint)bVar1;
            iVar28 = iVar29 * 0x55;
            iVar37 = (uint)(byte)Expand6[uVar20 >> 5 & 0x3f] - (uint)bVar2;
            iVar33 = iVar37 * 0x55;
            iVar16 = (uint)(byte)Expand5[uVar34 & 0x1f] - (uint)bVar3;
            iVar36 = iVar16 * 0x55;
            uStack_f0 = CONCAT71(CONCAT61(CONCAT51(uStack_f0._3_5_,
                                                   (char)(iVar28 + (iVar28 + 0x80U >> 8) + 0x80 >> 8
                                                         ) + bVar1),
                                          (char)(iVar33 + (iVar33 + 0x80U >> 8) + 0x80 >> 8) + bVar2
                                         ),
                                 (char)(iVar36 + (iVar36 + 0x80U >> 8) + 0x80 >> 8) + bVar3);
            uVar8 = uStack_f0;
            iVar29 = iVar29 * 0xaa;
            uStack_f0._7_1_ = SUB81(uVar7,7);
            iVar37 = iVar37 * 0xaa;
            iVar16 = iVar16 * 0xaa;
            uStack_f0._0_4_ = (undefined4)uVar8;
            uStack_f0._0_5_ =
                 CONCAT14((char)(iVar16 + (iVar16 + 0x80U >> 8) + 0x80 >> 8) + bVar3,
                          (undefined4)uStack_f0);
            uStack_f0 = CONCAT35(CONCAT21(CONCAT11(uStack_f0._7_1_,
                                                   (char)(iVar29 + (iVar29 + 0x80U >> 8) + 0x80 >> 8
                                                         ) + bVar1),
                                          (char)(iVar37 + (iVar37 + 0x80U >> 8) + 0x80 >> 8) + bVar2
                                         ),(undefined5)uStack_f0);
            uVar22 = MatchColorsBlock(local_d8,(Pixel *)&local_f8,quality != 0);
            uVar13 = uVar32;
          }
        }
      }
    }
  }
  uVar21 = uVar22 ^ 0x55555555;
  uVar38 = uVar13;
  if (uVar13 < uVar19) {
    uVar38 = uVar19;
  }
  if (uVar13 <= uVar19) {
    uVar21 = uVar22;
    uVar19 = uVar13;
  }
  *(ushort *)dest = uVar38;
  *(ushort *)((long)dest + 2) = uVar19;
  *(uint *)((long)dest + 4) = uVar21;
  return;
}

Assistant:

void sCompressDXTBlock(sU8* dest, const sU32* src, sBool alpha, sInt quality) {
  CRNLIB_ASSERT(Expand5[1]);

  // if alpha specified, compress alpha as well
  if (alpha) {
    CompressAlphaBlock(dest, src);
    dest += 8;
  }

  // compress the color part
  CompressColorBlock(dest, src, quality);
}